

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O0

int ffmnhd(fitsfile *fptr,int exttype,char *hduname,int hduver,int *status)

{
  int iVar1;
  size_t sVar2;
  int in_ECX;
  char *in_RDX;
  int in_ESI;
  long in_RDI;
  int *in_R8;
  long extver;
  int chopped;
  int putback;
  int slen;
  int exact;
  int match;
  int tstatus;
  int extnum;
  int alttype;
  int hdutype;
  int ii;
  char extname [71];
  fitsfile *in_stack_ffffffffffffff58;
  int iVar3;
  int iVar4;
  int local_94;
  int local_84;
  int local_80;
  char local_78 [16];
  int *in_stack_ffffffffffffff98;
  char *in_stack_ffffffffffffffa0;
  long *in_stack_ffffffffffffffa8;
  char *in_stack_ffffffffffffffb0;
  fitsfile *in_stack_ffffffffffffffb8;
  int *in_stack_ffffffffffffffc0;
  int *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd8;
  int local_4;
  
  iVar4 = 0;
  iVar3 = 0;
  if (*in_R8 < 1) {
    if ((*(int *)(*(long *)(in_RDI + 8) + 0x1c) != 0) &&
       (sVar2 = strlen(in_RDX), in_RDX[(int)sVar2 + -1] != '#')) {
      iVar4 = 1;
    }
    do {
      do {
        do {
          iVar1 = ffmahd((fitsfile *)CONCAT44(in_ECX,in_stack_ffffffffffffffd8),
                         (int)((ulong)in_R8 >> 0x20),in_stack_ffffffffffffffc8,
                         in_stack_ffffffffffffffc0);
          if (iVar1 != 0) {
            ffmahd((fitsfile *)CONCAT44(in_ECX,in_stack_ffffffffffffffd8),
                   (int)((ulong)in_R8 >> 0x20),in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
            *in_R8 = 0x12d;
            return 0x12d;
          }
          local_84 = -1;
          iVar1 = fits_is_compressed_image(in_stack_ffffffffffffff58,(int *)0x18c5aa);
          if (iVar1 != 0) {
            local_84 = 2;
          }
        } while (((in_ESI != -1) && (local_80 != in_ESI)) && (local_80 != local_84));
        ffmaky((fitsfile *)CONCAT44(iVar4,iVar3),(int)((ulong)in_stack_ffffffffffffff58 >> 0x20),
               (int *)0x18c5f3);
        iVar1 = ffgkys(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
                       (char *)in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
                       in_stack_ffffffffffffff98);
        if (iVar1 < 1) {
          if (iVar4 != 0) {
            iVar3 = 0;
            sVar2 = strlen(local_78);
            if (local_78[(int)sVar2 + -1] == '#') {
              local_78[(int)sVar2 + -1] = '\0';
              iVar3 = 1;
            }
          }
          ffcmps((char *)extname._16_8_,(char *)extname._8_8_,extname._4_4_,_hdutype,_extnum);
        }
        if ((local_94 == 0) &&
           (iVar1 = ffgkys(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
                           (char *)in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
                           in_stack_ffffffffffffff98), iVar1 < 1)) {
          if (iVar4 != 0) {
            iVar3 = 0;
            sVar2 = strlen(local_78);
            if (local_78[(int)sVar2 + -1] == '#') {
              local_78[(int)sVar2 + -1] = '\0';
              iVar3 = 1;
            }
          }
          ffcmps((char *)extname._16_8_,(char *)extname._8_8_,extname._4_4_,_hdutype,_extnum);
        }
      } while (local_94 == 0);
      if (in_ECX == 0) {
        if (iVar3 != 0) {
          *(undefined4 *)(*(long *)(in_RDI + 8) + 0x1c) = 0;
        }
        return *in_R8;
      }
      iVar1 = ffgkyj(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
                     in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
      if (0 < iVar1) {
        in_stack_ffffffffffffff58 = (fitsfile *)0x1;
      }
    } while ((int)in_stack_ffffffffffffff58 != in_ECX);
    if (iVar3 != 0) {
      *(undefined4 *)(*(long *)(in_RDI + 8) + 0x1c) = 0;
    }
    local_4 = *in_R8;
  }
  else {
    local_4 = *in_R8;
  }
  return local_4;
}

Assistant:

int ffmnhd(fitsfile *fptr,      /* I - FITS file pointer                    */
           int exttype,         /* I - desired extension type               */
           char *hduname,       /* I - desired EXTNAME value for the HDU    */
           int hduver,          /* I - desired EXTVERS value for the HDU    */
           int *status)         /* IO - error status                        */
/*
  Move to the next HDU with a given extension type (IMAGE_HDU, ASCII_TBL,
  BINARY_TBL, or ANY_HDU), extension name (EXTNAME or HDUNAME keyword),
  and EXTVERS keyword values.  If hduvers = 0, then move to the first HDU
  with the given type and name regardless of EXTVERS value.  If no matching
  HDU is found in the file, then the current open HDU will remain unchanged.
*/
{
    char extname[FLEN_VALUE];
    int ii, hdutype, alttype, extnum, tstatus, match, exact;
    int slen, putback = 0, chopped = 0;
    long extver;

    if (*status > 0)
        return(*status);

    extnum = fptr->HDUposition + 1;  /* save the current HDU number */

    /*
       This is a kludge to deal with a special case where the
       user specified a hduname that ended with a # character, which
       CFITSIO previously interpreted as a flag to mean "don't copy any
       other HDUs in the file into the virtual file in memory.  If the
       remaining hduname does not end with a # character (meaning that
       the user originally entered a hduname ending in 2 # characters)
       then there is the possibility that the # character should be
       treated literally, if the actual EXTNAME also ends with a #.
       Setting putback = 1 means that we need to test for this case later on.
    */
        
    if ((fptr->Fptr)->only_one) {  /* if true, name orignally ended with a # */
       slen = strlen(hduname);
       if (hduname[slen - 1] != '#') /* This will fail if real EXTNAME value */
           putback = 1;              /*  ends with 2 # characters. */
    } 

    for (ii=1; 1; ii++)    /* loop over all HDUs until EOF */
    {
        tstatus = 0;
        if (ffmahd(fptr, ii, &hdutype, &tstatus))  /* move to next HDU */
        {
           ffmahd(fptr, extnum, 0, status); /* restore original file position */
           return(*status = BAD_HDU_NUM);   /* couldn't find desired HDU */
        }

        alttype = -1; 
        if (fits_is_compressed_image(fptr, status))
            alttype = BINARY_TBL;
        
        /* Does this HDU have a matching type? */
        if (exttype == ANY_HDU || hdutype == exttype || hdutype == alttype)
        {
          ffmaky(fptr, 2, status); /* reset to the 2nd keyword in the header */
          if (ffgkys(fptr, "EXTNAME", extname, 0, &tstatus) <= 0) /* get keyword */
          {
               if (putback) {          /* more of the kludge */
                   /* test if the EXTNAME value ends with a #;  if so, chop it  */
		   /* off before comparing the strings */
		   chopped = 0;
	           slen = strlen(extname);
		   if (extname[slen - 1] == '#') {
		       extname[slen - 1] = '\0'; 
                       chopped = 1;
                   }
               }

               /* see if the strings are an exact match */
               ffcmps(hduname, extname, CASEINSEN, &match, &exact);
          }

          /* if EXTNAME keyword doesn't exist, or it does not match, then try HDUNAME */
          if (tstatus || !exact)
	  {
               tstatus = 0;
               if (ffgkys(fptr, "HDUNAME", extname, 0, &tstatus) <= 0)
	       {
                   if (putback) {          /* more of the kludge */
		       chopped = 0;
	               slen = strlen(extname);
		       if (extname[slen - 1] == '#') {
		           extname[slen - 1] = '\0';  /* chop off the # */
                           chopped = 1;
                       }
                   }

                   /* see if the strings are an exact match */
                   ffcmps(hduname, extname, CASEINSEN, &match, &exact);
               }
          }

          if (!tstatus && exact)    /* found a matching name */
          {
             if (hduver)  /* need to check if version numbers match? */
             {
                if (ffgkyj(fptr, "EXTVER", &extver, 0, &tstatus) > 0)
                    extver = 1;  /* assume default EXTVER value */

                if ( (int) extver == hduver)
                {
                    if (chopped) {
                        /* The # was literally part of the name, not a flag */
	                (fptr->Fptr)->only_one = 0;  
                    }
                    return(*status);    /* found matching name and vers */
                }
             }
             else
             {
                 if (chopped) {
                     /* The # was literally part of the name, not a flag */
	            (fptr->Fptr)->only_one = 0;  
                 }
                 return(*status);    /* found matching name */
             }
          }  /* end of !tstatus && exact */

        }  /* end of matching HDU type */
    }  /* end of loop over HDUs */
}